

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

string * pretty_abi_cxx11_(string *__return_storage_ptr__,size_t value,size_t scale,char **units,
                          int m)

{
  long lVar1;
  float fVar2;
  char buffer [256];
  allocator local_119;
  char local_118 [264];
  
  fVar2 = (float)value;
  for (lVar1 = 0; ((float)scale < fVar2 && ((int)lVar1 < m + -1)); lVar1 = lVar1 + 1) {
    fVar2 = fVar2 / (float)scale;
  }
  sprintf(local_118,"%.6f %s",(double)fVar2,units[lVar1]);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_118,&local_119);
  return __return_storage_ptr__;
}

Assistant:

std::string pretty(size_t value, size_t scale, const char* *units, int m) {
    int count = 0;
    float d = value;
    while (d > scale && count < m - 1) {
        d /= scale;
        count += 1;
    }
    char buffer[256];
    sprintf(buffer, "%.6f %s", d, units[count]);
    return buffer;
}